

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O1

ze_result_t
loader::zeFabricVertexGetSubVerticesExp
          (ze_fabric_vertex_handle_t hVertex,uint32_t *pCount,
          ze_fabric_vertex_handle_t *phSubvertices)

{
  ze_pfnFabricVertexGetSubVerticesExp_t p_Var1;
  ze_result_t zVar2;
  object_t<_ze_fabric_vertex_handle_t_*> *poVar3;
  ulong uVar4;
  long lVar5;
  dditable_t *dditable;
  dditable_t *local_38;
  
  local_38 = *(dditable_t **)(hVertex + 8);
  p_Var1 = (local_38->ze).FabricVertexExp.pfnGetSubVerticesExp;
  if (p_Var1 == (ze_pfnFabricVertexGetSubVerticesExp_t)0x0) {
    zVar2 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    zVar2 = (*p_Var1)(*(ze_fabric_vertex_handle_t *)hVertex,pCount,phSubvertices);
    if (zVar2 == ZE_RESULT_SUCCESS) {
      zVar2 = ZE_RESULT_SUCCESS;
      if (phSubvertices != (ze_fabric_vertex_handle_t *)0x0) {
        lVar5 = 0;
        uVar4 = 0;
        do {
          if (*pCount <= uVar4) {
            return ZE_RESULT_SUCCESS;
          }
          poVar3 = singleton_factory_t<object_t<_ze_fabric_vertex_handle_t*>,_ze_fabric_vertex_handle_t*>
                   ::getInstance<_ze_fabric_vertex_handle_t*&,dditable_t*&>
                             ((singleton_factory_t<object_t<_ze_fabric_vertex_handle_t*>,_ze_fabric_vertex_handle_t*>
                               *)(context + 0x360),
                              (_ze_fabric_vertex_handle_t **)((long)phSubvertices + lVar5),&local_38
                             );
          phSubvertices[uVar4] = (ze_fabric_vertex_handle_t)poVar3;
          uVar4 = uVar4 + 1;
          lVar5 = lVar5 + 8;
          zVar2 = ZE_RESULT_SUCCESS;
        } while (phSubvertices != (ze_fabric_vertex_handle_t *)0x0);
      }
    }
  }
  return zVar2;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFabricVertexGetSubVerticesExp(
        ze_fabric_vertex_handle_t hVertex,              ///< [in] handle of the fabric vertex object
        uint32_t* pCount,                               ///< [in,out] pointer to the number of sub-vertices.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of sub-vertices available.
                                                        ///< if count is greater than the number of sub-vertices available, then
                                                        ///< the driver shall update the value with the correct number of
                                                        ///< sub-vertices available.
        ze_fabric_vertex_handle_t* phSubvertices        ///< [in,out][optional][range(0, *pCount)] array of handle of sub-vertices.
                                                        ///< if count is less than the number of sub-vertices available, then
                                                        ///< driver shall only retrieve that number of sub-vertices.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_fabric_vertex_object_t*>( hVertex )->dditable;
        auto pfnGetSubVerticesExp = dditable->ze.FabricVertexExp.pfnGetSubVerticesExp;
        if( nullptr == pfnGetSubVerticesExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hVertex = reinterpret_cast<ze_fabric_vertex_object_t*>( hVertex )->handle;

        // forward to device-driver
        result = pfnGetSubVerticesExp( hVertex, pCount, phSubvertices );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handles to loader handles
            for( size_t i = 0; ( nullptr != phSubvertices ) && ( i < *pCount ); ++i )
                phSubvertices[ i ] = reinterpret_cast<ze_fabric_vertex_handle_t>(
                    context->ze_fabric_vertex_factory.getInstance( phSubvertices[ i ], dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }